

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_utils.cpp
# Opt level: O3

void __thiscall
icu_63::number::impl::DecNum::_setTo(DecNum *this,char *str,int32_t maxDigits,UErrorCode *status)

{
  uint uVar1;
  decNumber *buffer;
  uint8_t uVar2;
  undefined2 uVar3;
  int32_t iVar4;
  int32_t iVar5;
  UErrorCode UVar6;
  decNumber *pdVar7;
  
  iVar5 = 0x22;
  if ((0x22 < maxDigits) &&
     (pdVar7 = (decNumber *)uprv_malloc_63((ulong)(maxDigits + 0xc)), iVar5 = maxDigits,
     pdVar7 != (decNumber *)0x0)) {
    buffer = (this->fData).ptr;
    uVar2 = buffer->lsu[0];
    uVar3 = *(undefined2 *)&buffer->field_0xa;
    pdVar7->bits = buffer->bits;
    pdVar7->lsu[0] = uVar2;
    *(undefined2 *)&pdVar7->field_0xa = uVar3;
    iVar4 = buffer->exponent;
    pdVar7->digits = buffer->digits;
    pdVar7->exponent = iVar4;
    if ((this->fData).needToRelease != '\0') {
      uprv_free_63(buffer);
    }
    (this->fData).ptr = pdVar7;
    (this->fData).capacity = maxDigits;
    (this->fData).needToRelease = '\x01';
  }
  (this->fContext).digits = iVar5;
  uprv_decNumberFromString_63((this->fData).ptr,str,&this->fContext);
  uVar1 = (this->fContext).status;
  UVar6 = U_DECIMAL_NUMBER_SYNTAX_ERROR;
  if ((((uVar1 & 1) != 0) || (UVar6 = U_UNSUPPORTED_ERROR, uVar1 != 0)) ||
     ((((this->fData).ptr)->bits & 0x70) != 0)) {
    *status = UVar6;
  }
  return;
}

Assistant:

void DecNum::_setTo(const char* str, int32_t maxDigits, UErrorCode& status) {
    if (maxDigits > kDefaultDigits) {
        fData.resize(maxDigits, 0);
        fContext.digits = maxDigits;
    } else {
        fContext.digits = kDefaultDigits;
    }

    static_assert(DECDPUN == 1, "Assumes that DECDPUN is set to 1");
    uprv_decNumberFromString(fData.getAlias(), str, &fContext);

    // Check for invalid syntax and set the corresponding error code.
    if ((fContext.status & DEC_Conversion_syntax) != 0) {
        status = U_DECIMAL_NUMBER_SYNTAX_ERROR;
        return;
    } else if (fContext.status != 0) {
        // Not a syntax error, but some other error, like an exponent that is too large.
        status = U_UNSUPPORTED_ERROR;
        return;
    }

    // For consistency with Java BigDecimal, no support for DecNum that is NaN or Infinity!
    if (decNumberIsSpecial(fData.getAlias())) {
        status = U_UNSUPPORTED_ERROR;
        return;
    }
}